

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O3

int pybind11_object_init(PyObject *self,PyObject *param_2,PyObject *param_3)

{
  long *plVar1;
  long *plVar2;
  string msg;
  allocator<char> local_51;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  long *local_30 [2];
  long local_20 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,self->ob_type->tp_name,&local_51);
  plVar1 = (long *)std::__cxx11::string::append((char *)local_30);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_40 = *plVar2;
    lStack_38 = plVar1[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar2;
    local_50 = (long *)*plVar1;
  }
  local_48 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  PyErr_SetString(_PyExc_TypeError,local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  return -1;
}

Assistant:

inline int pybind11_object_init(PyObject *self, PyObject *, PyObject *) {
    PyTypeObject *type = Py_TYPE(self);
    std::string msg = get_fully_qualified_tp_name(type) + ": No constructor defined!";
    PyErr_SetString(PyExc_TypeError, msg.c_str());
    return -1;
}